

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestMergeExceptionLite::~TestMergeExceptionLite(TestMergeExceptionLite *this)

{
  SharedDtor(&this->super_MessageLite);
  return;
}

Assistant:

TestMergeExceptionLite::~TestMergeExceptionLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMergeExceptionLite)
  SharedDtor(*this);
}